

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_threads.cc
# Opt level: O2

void __thiscall AllReduceSync::AllReduceSync(AllReduceSync *this,size_t total)

{
  mutex *pmVar1;
  condition_variable *this_00;
  void **ppvVar2;
  
  this->m_total = total;
  this->m_count = 0;
  this->m_run = true;
  pmVar1 = (mutex *)operator_new(0x28);
  (pmVar1->super___mutex_base)._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pmVar1->super___mutex_base)._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(pmVar1->super___mutex_base)._M_mutex + 0x10) = 0;
  (pmVar1->super___mutex_base)._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (pmVar1->super___mutex_base)._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  this->m_mutex = pmVar1;
  this_00 = (condition_variable *)operator_new(0x30);
  std::condition_variable::condition_variable(this_00);
  this->m_cv = this_00;
  ppvVar2 = (void **)operator_new__(-(ulong)(total >> 0x3d != 0) | total << 3);
  this->buffers = ppvVar2;
  return;
}

Assistant:

AllReduceSync::AllReduceSync(const size_t total) : m_total(total), m_count(0), m_run(true)
{
  m_mutex = new mutex;
  m_cv = new condition_variable;
  buffers = new void*[total];
}